

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::AddIncludeFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang)

{
  cmMakefile *this_00;
  string *psVar1;
  ulong uVar2;
  char *name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends;
  string local_190;
  undefined1 local_170 [8];
  string arg;
  string local_148 [8];
  string name;
  string responseFlag;
  undefined1 local_e8 [8];
  string responseFlagVar;
  undefined1 local_c0 [8];
  string includeFlags;
  string local_98;
  string *local_78;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  bool useResponseFile;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string responseVar;
  string *lang_local;
  string *flags_local;
  cmMakefileTargetGenerator *this_local;
  
  responseVar.field_2._8_8_ = lang;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"CMAKE_",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::operator+=((string *)local_40,(string *)responseVar.field_2._8_8_);
  std::__cxx11::string::operator+=((string *)local_40,"_USE_RESPONSE_FILE_FOR_INCLUDES");
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ =
       cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,(string *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&config);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_BUILD_TYPE",
             (allocator<char> *)(includeFlags.field_2._M_local_buf + 0xf));
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(includeFlags.field_2._M_local_buf + 0xf));
  local_78 = psVar1;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             (string *)responseVar.field_2._8_8_,psVar1);
  cmLocalGenerator::GetIncludeFlags
            ((string *)local_c0,(cmLocalGenerator *)this->LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,(this->super_cmCommonTargetGenerator).GeneratorTarget,
             (string *)responseVar.field_2._8_8_,false,
             (bool)(includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1),local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    if ((includes.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,local_c0);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&responseFlag.field_2 + 8),"CMAKE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     responseVar.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&responseFlag.field_2 + 8),"_RESPONSE_FILE_FLAG");
      std::__cxx11::string::~string((string *)(responseFlag.field_2._M_local_buf + 8));
      psVar1 = cmMakefile::GetSafeDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_e8);
      std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),(string *)psVar1);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::operator=((string *)(name.field_2._M_local_buf + 8),"@");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_148,"includes_",(allocator<char> *)(arg.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(arg.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=(local_148,(string *)responseVar.field_2._8_8_);
      std::__cxx11::string::operator+=(local_148,".rsp");
      name_00 = (char *)std::__cxx11::string::c_str();
      makefile_depends =
           &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
            ::operator[](&this->FlagFileDepends,(key_type *)responseVar.field_2._8_8_)->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      CreateResponseFile(&local_190,this,name_00,(string *)local_c0,makefile_depends);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8),&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,local_170);
      std::__cxx11::string::~string((string *)local_170);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_e8);
    }
    responseFlagVar.field_2._12_4_ = 0;
  }
  else {
    responseFlagVar.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&config);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddIncludeFlags(std::string& flags,
                                                const std::string& lang)
{
  std::string responseVar = "CMAKE_";
  responseVar += lang;
  responseVar += "_USE_RESPONSE_FILE_FOR_INCLUDES";
  bool useResponseFile = this->Makefile->IsOn(responseVar);

  std::vector<std::string> includes;
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);

  std::string includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, lang, false, useResponseFile, config);
  if (includeFlags.empty()) {
    return;
  }

  if (useResponseFile) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    std::string responseFlag =
      this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty()) {
      responseFlag = "@";
    }
    std::string name = "includes_";
    name += lang;
    name += ".rsp";
    std::string arg = std::move(responseFlag) +
      this->CreateResponseFile(name.c_str(), includeFlags,
                               this->FlagFileDepends[lang]);
    this->LocalGenerator->AppendFlags(flags, arg);
  } else {
    this->LocalGenerator->AppendFlags(flags, includeFlags);
  }
}